

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O0

char * zt_cstr_sub(char *s,ssize_t i,ssize_t j)

{
  size_t num;
  ssize_t sVar1;
  char *pcVar2;
  char *in_RDI;
  ssize_t t;
  size_t len;
  char *p;
  char *new;
  size_t in_stack_ffffffffffffffc8;
  char *local_28;
  long local_18;
  ssize_t local_10;
  
  num = strlen(in_RDI);
  if (num == 0) {
    local_10 = 0;
    local_18 = 0;
  }
  else {
    local_10 = IDX(num,in_stack_ffffffffffffffc8);
    sVar1 = IDX(num,in_stack_ffffffffffffffc8);
    local_18 = sVar1;
    if (sVar1 < local_10) {
      local_18 = local_10;
      local_10 = sVar1;
    }
  }
  IDXLEN(local_10,local_18);
  pcVar2 = (char *)zt_malloc_p(num);
  local_28 = pcVar2;
  while (local_10 <= local_18) {
    *local_28 = in_RDI[local_10];
    local_28 = local_28 + 1;
    local_10 = local_10 + 1;
  }
  *local_28 = '\0';
  return pcVar2;
}

Assistant:

char *
zt_cstr_sub(const char *s, ssize_t i, ssize_t j) {
    char * new;
    char * p;

    CONVERT(s, i, j);

    new = zt_malloc(char, IDXLEN(i, j) + 1);

    p   = new;

    while (i <= j) {
        *p++ = s[i++];
    }
    *p  = '\0';
    return new;
}